

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLURL.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::XMLURL::conglomerateWithBase(XMLURL *this,XMLURL *baseURL,bool useExceptions)

{
  Protocols PVar1;
  bool bVar2;
  MalformedURLException *this_00;
  XMLCh *pXVar3;
  XMLCh *pXVar4;
  
  bVar2 = isRelative(baseURL);
  if (bVar2) {
    if (useExceptions) {
      this_00 = (MalformedURLException *)__cxa_allocate_exception(0x30);
      MalformedURLException::MalformedURLException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLURL.cpp"
                 ,0x340,URL_RelativeBaseURL,this->fMemoryManager);
      __cxa_throw(this_00,&MalformedURLException::typeinfo,XMLException::~XMLException);
    }
    goto LAB_0026cd68;
  }
  if (this->fProtocol != Unknown) goto LAB_0026cd68;
  if (((this->fHost == (XMLCh *)0x0) && (this->fPath == (XMLCh *)0x0)) &&
     (this->fFragment != (XMLCh *)0x0)) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
    this->fUser = (XMLCh *)0x0;
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
    this->fPassword = (XMLCh *)0x0;
    PVar1 = baseURL->fProtocol;
    this->fPortNum = baseURL->fPortNum;
    this->fProtocol = PVar1;
    pXVar3 = XMLString::replicate(baseURL->fHost,this->fMemoryManager);
    this->fHost = pXVar3;
    pXVar3 = XMLString::replicate(baseURL->fUser,this->fMemoryManager);
    this->fUser = pXVar3;
    pXVar3 = XMLString::replicate(baseURL->fPassword,this->fMemoryManager);
    this->fPassword = pXVar3;
    pXVar3 = XMLString::replicate(baseURL->fPath,this->fMemoryManager);
    this->fPath = pXVar3;
    goto LAB_0026cd68;
  }
  PVar1 = baseURL->fProtocol;
  this->fProtocol = PVar1;
  if (PVar1 == File) {
    if (baseURL->fHost != (XMLCh *)0x0) goto LAB_0026ccaf;
  }
  else {
    if ((this->fHost != (XMLCh *)0x0) || (baseURL->fHost == (XMLCh *)0x0)) goto LAB_0026cd68;
LAB_0026ccaf:
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fUser);
    this->fUser = (XMLCh *)0x0;
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPassword);
    this->fPassword = (XMLCh *)0x0;
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fHost);
    this->fHost = (XMLCh *)0x0;
    pXVar3 = XMLString::replicate(baseURL->fHost,this->fMemoryManager);
    this->fHost = pXVar3;
    pXVar3 = XMLString::replicate(baseURL->fUser,this->fMemoryManager);
    this->fUser = pXVar3;
    pXVar3 = XMLString::replicate(baseURL->fPassword,this->fMemoryManager);
    this->fPassword = pXVar3;
    this->fPortNum = baseURL->fPortNum;
  }
  pXVar3 = this->fPath;
  if ((pXVar3 == (XMLCh *)0x0) || (*pXVar3 != L'/')) {
    if (baseURL->fPath != (XMLCh *)0x0) {
      pXVar4 = XMLPlatformUtils::weavePaths(baseURL->fPath,pXVar3,this->fMemoryManager);
      (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPath);
      this->fPath = pXVar4;
    }
    if (((pXVar3 == (XMLCh *)0x0) && (this->fQuery == (XMLCh *)0x0)) &&
       (baseURL->fQuery != (XMLCh *)0x0)) {
      pXVar3 = XMLString::replicate(baseURL->fQuery,this->fMemoryManager);
      this->fQuery = pXVar3;
      if ((this->fFragment == (XMLCh *)0x0) && (baseURL->fFragment != (XMLCh *)0x0)) {
        pXVar3 = XMLString::replicate(baseURL->fFragment,this->fMemoryManager);
        this->fFragment = pXVar3;
      }
    }
  }
LAB_0026cd68:
  return !bVar2;
}

Assistant:

bool XMLURL::conglomerateWithBase(const XMLURL& baseURL, bool useExceptions)
{
    // The base URL cannot be relative
    if (baseURL.isRelative())
    {
        if (useExceptions)
			ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_RelativeBaseURL, fMemoryManager);
        else
            return false;
    }

    //
    //  Check a special case. If all we have is a fragment, then we want
    //  to just take the base host and path, plus our fragment.
    //
    if ((fProtocol == Unknown)
    &&  !fHost
    &&  !fPath
    &&  fFragment)
    {
        // Just in case, make sure we don't leak the user or password values
        fMemoryManager->deallocate(fUser);//delete [] fUser;
        fUser = 0;
        fMemoryManager->deallocate(fPassword);//delete [] fPassword;
        fPassword = 0;

        // Copy over the protocol and port number as is
        fProtocol = baseURL.fProtocol;
        fPortNum = baseURL.fPortNum;

        // Replicate the base fields that are provided
        fHost = XMLString::replicate(baseURL.fHost, fMemoryManager);
        fUser = XMLString::replicate(baseURL.fUser, fMemoryManager);
        fPassword = XMLString::replicate(baseURL.fPassword, fMemoryManager);
        fPath = XMLString::replicate(baseURL.fPath, fMemoryManager);
        return true;
    }

    //
    //  All we have to do is run up through our fields and, for each one
    //  that we don't have, use the based URL's. Once we hit one field
    //  that we have, we stop.
    //
    if (fProtocol != Unknown)
        return true;
    fProtocol = baseURL.fProtocol;

    //
    //  If the protocol is not file, and we either already have our own
    //  host, or the base does not have one, then we are done.
    //
    if (fProtocol != File)
    {
        if (fHost || !baseURL.fHost)
            return true;
    }

    // Replicate all of the hosty stuff if the base has one
    if (baseURL.fHost)
    {
        // Just in case, make sure we don't leak a user or password field
        fMemoryManager->deallocate(fUser);//delete [] fUser;
        fUser = 0;
        fMemoryManager->deallocate(fPassword);//delete [] fPassword;
        fPassword = 0;
        fMemoryManager->deallocate(fHost);//delete [] fHost;
        fHost = 0;

        fHost = XMLString::replicate(baseURL.fHost, fMemoryManager);
        fUser = XMLString::replicate(baseURL.fUser, fMemoryManager);
        fPassword = XMLString::replicate(baseURL.fPassword, fMemoryManager);

        fPortNum = baseURL.fPortNum;
    }

    // If we have a path and its absolute, then we are done
    const bool hadPath = (fPath != 0);
    if (hadPath)
    {
        if (*fPath == chForwardSlash)
            return true;
    }

    // Its a relative path, so weave them together.
    if (baseURL.fPath) {
        XMLCh* temp = XMLPlatformUtils::weavePaths(baseURL.fPath, fPath ,fMemoryManager);
        fMemoryManager->deallocate(fPath);//delete [] fPath;
        fPath = temp;
    }

    // If we had any original path, then we are done
    if (hadPath)
        return true;

    // We had no original path, so go on to deal with the query/fragment parts
    if (fQuery || !baseURL.fQuery)
        return true;
    fQuery = XMLString::replicate(baseURL.fQuery, fMemoryManager);

    if (fFragment || !baseURL.fFragment)
        return true;
    fFragment = XMLString::replicate(baseURL.fFragment, fMemoryManager);
	return true;
}